

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O3

void __thiscall
helics::FilterFederate::processFilterInfo(FilterFederate *this,ActionMessage *command)

{
  pointer *pppFVar1;
  byte *pbVar2;
  GlobalBrokerId GVar3;
  InterfaceHandle IVar4;
  pointer ppFVar5;
  byte *pbVar6;
  iterator iVar7;
  size_t size;
  string_view type_in;
  string_view type_in_00;
  string_view type_out;
  string_view type_out_00;
  undefined8 uVar8;
  FilterInfo **filt;
  FilterCoordinator *pFVar9;
  const_iterator cVar10;
  string *psVar11;
  _Head_base<0UL,_helics::FilterInfo_*,_false> _Var12;
  pointer ppFVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  BasicHandleInfo *pBVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  FilterInfo *pFVar17;
  string_view key;
  string_view key_00;
  ActionMessage err;
  _Head_base<0UL,_helics::FilterInfo_*,_false> local_168;
  size_t local_160;
  undefined1 local_158 [32];
  size_t local_138;
  char *pcStack_130;
  size_t local_128;
  char *pcStack_120;
  size_t local_118;
  char *pcStack_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  ActionMessage local_e8;
  
  pFVar9 = getFilterCoordinator(this,(InterfaceHandle)(command->dest_handle).hid);
  if (pFVar9 != (FilterCoordinator *)0x0) {
    if ((command->flags & 2) == 0) {
      ppFVar13 = (pFVar9->allSourceFilters).
                 super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppFVar5 = (pFVar9->allSourceFilters).
                super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppFVar13 != ppFVar5) {
        do {
          if ((((*ppFVar13)->core_id).gid == (command->source_id).gid) &&
             (((*ppFVar13)->handle).hid == (command->source_handle).hid)) {
            return;
          }
          ppFVar13 = ppFVar13 + 1;
        } while (ppFVar13 != ppFVar5);
      }
      local_e8.messageAction = (command->source_id).gid;
      local_e8.messageID = (command->source_handle).hid;
      cVar10 = std::
               _Hashtable<helics::GlobalHandle,_std::pair<const_helics::GlobalHandle,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalHandle>,_std::hash<helics::GlobalHandle>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&(this->filters).lookup._M_h,(key_type *)&local_e8);
      if ((cVar10.
           super__Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false>.
           _M_cur == (__node_type *)0x0) ||
         (_Var12._M_head_impl =
               *(FilterInfo **)
                &(this->filters).dataStorage.
                 super__Vector_base<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>,_std::allocator<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [*(long *)((long)cVar10.
                                  super__Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false>
                                  ._M_cur + 0x10)]._M_t.
                 super___uniq_ptr_impl<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>
         , local_168._M_head_impl = _Var12._M_head_impl,
         (tuple<helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>)_Var12._M_head_impl
         == (_Head_base<0UL,_helics::FilterInfo_*,_false>)0x0)) {
        GVar3.gid = (command->source_id).gid;
        IVar4.hid = (command->source_handle).hid;
        pbVar6 = (command->payload).heap;
        local_e8._0_8_ = &local_e8.dest_id;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,pbVar6,pbVar6 + (command->payload).bufferSize);
        uVar8 = local_e8._0_8_;
        psVar11 = ActionMessage::getString_abi_cxx11_(command,0);
        pcStack_130 = (psVar11->_M_dataplus)._M_p;
        local_138 = psVar11->_M_string_length;
        psVar11 = ActionMessage::getString_abi_cxx11_(command,1);
        local_158._24_8_ = (psVar11->_M_dataplus)._M_p;
        local_158._16_8_ = psVar11->_M_string_length;
        type_in._M_str = pcStack_130;
        type_in._M_len = local_138;
        type_out._M_str = (char *)local_158._24_8_;
        type_out._M_len = local_158._16_8_;
        key._M_str = (char *)uVar8;
        key._M_len._0_4_ = local_e8.source_id.gid;
        key._M_len._4_4_ = local_e8.source_handle.hid;
        _Var12._M_head_impl =
             createFilter(this,GVar3,IVar4,key,type_in,type_out,
                          (bool)((byte)(command->flags >> 9) & 1));
        local_168._M_head_impl = _Var12._M_head_impl;
        if ((GlobalFederateId *)local_e8._0_8_ != &local_e8.dest_id) {
          operator_delete((void *)local_e8._0_8_,
                          CONCAT44(local_e8.dest_handle.hid,local_e8.dest_id.gid) + 1);
        }
      }
      iVar7._M_current =
           (pFVar9->allSourceFilters).
           super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (pFVar9->allSourceFilters).
          super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<helics::FilterInfo*,std::allocator<helics::FilterInfo*>>::
        _M_realloc_insert<helics::FilterInfo*const&>
                  ((vector<helics::FilterInfo*,std::allocator<helics::FilterInfo*>> *)
                   &pFVar9->allSourceFilters,iVar7,&local_168._M_head_impl);
      }
      else {
        *iVar7._M_current = _Var12._M_head_impl;
        pppFVar1 = &(pFVar9->allSourceFilters).
                    super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppFVar1 = *pppFVar1 + 1;
      }
      pFVar9->hasSourceFilters = true;
      pBVar15 = HandleManager::getInterfaceHandle
                          (this->mHandles,(InterfaceHandle)(command->dest_handle).hid,ENDPOINT);
      if (pBVar15 != (BasicHandleInfo *)0x0) {
        pbVar2 = (byte *)((long)&pBVar15->flags + 1);
        *pbVar2 = *pbVar2 | 8;
      }
    }
    else {
      if ((command->flags >> 9 & 1) == 0) {
        pFVar17 = pFVar9->destFilter;
        if (((pFVar17 != (FilterInfo *)0x0) && ((pFVar17->core_id).gid == (command->source_id).gid))
           && ((pFVar17->handle).hid == (command->source_handle).hid)) {
          return;
        }
      }
      else {
        ppFVar13 = (pFVar9->cloningDestFilters).
                   super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppFVar5 = (pFVar9->cloningDestFilters).
                  super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (ppFVar13 != ppFVar5) {
          do {
            if ((((*ppFVar13)->core_id).gid == (command->source_id).gid) &&
               (((*ppFVar13)->handle).hid == (command->source_handle).hid)) {
              return;
            }
            ppFVar13 = ppFVar13 + 1;
          } while (ppFVar13 != ppFVar5);
        }
      }
      pBVar15 = HandleManager::getInterfaceHandle
                          (this->mHandles,(InterfaceHandle)(command->dest_handle).hid,ENDPOINT);
      if (((pBVar15 == (BasicHandleInfo *)0x0) ||
          (pbVar2 = (byte *)((long)&pBVar15->flags + 1), *pbVar2 = *pbVar2 | 0x20,
          (command->flags & 0x200) != 0)) || (pFVar9->hasDestFilters != true)) {
        local_e8.messageAction = (command->source_id).gid;
        local_e8.messageID = (command->source_handle).hid;
        cVar10 = std::
                 _Hashtable<helics::GlobalHandle,_std::pair<const_helics::GlobalHandle,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalHandle>,_std::hash<helics::GlobalHandle>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->filters).lookup._M_h,(key_type *)&local_e8);
        if ((cVar10.
             super__Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false>.
             _M_cur == (__node_type *)0x0) ||
           (_Var12._M_head_impl =
                 *(FilterInfo **)
                  &(this->filters).dataStorage.
                   super__Vector_base<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>,_std::allocator<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start
                   [*(long *)((long)cVar10.
                                    super__Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false>
                                    ._M_cur + 0x10)]._M_t.
                   super___uniq_ptr_impl<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>
           , local_168._M_head_impl = _Var12._M_head_impl,
           (tuple<helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>)
           _Var12._M_head_impl == (_Head_base<0UL,_helics::FilterInfo_*,_false>)0x0)) {
          GVar3.gid = (command->source_id).gid;
          IVar4.hid = (command->source_handle).hid;
          pbVar6 = (command->payload).heap;
          local_e8._0_8_ = &local_e8.dest_id;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e8,pbVar6,pbVar6 + (command->payload).bufferSize);
          uVar8 = local_e8._0_8_;
          psVar11 = ActionMessage::getString_abi_cxx11_(command,0);
          pcStack_110 = (psVar11->_M_dataplus)._M_p;
          local_118 = psVar11->_M_string_length;
          psVar11 = ActionMessage::getString_abi_cxx11_(command,1);
          pcStack_120 = (psVar11->_M_dataplus)._M_p;
          local_128 = psVar11->_M_string_length;
          type_in_00._M_str = pcStack_110;
          type_in_00._M_len = local_118;
          type_out_00._M_str = pcStack_120;
          type_out_00._M_len = local_128;
          key_00._M_str = (char *)uVar8;
          key_00._M_len._0_4_ = local_e8.source_id.gid;
          key_00._M_len._4_4_ = local_e8.source_handle.hid;
          _Var12._M_head_impl =
               createFilter(this,GVar3,IVar4,key_00,type_in_00,type_out_00,
                            (bool)((byte)(command->flags >> 9) & 1));
          local_168._M_head_impl = _Var12._M_head_impl;
          if ((GlobalFederateId *)local_e8._0_8_ != &local_e8.dest_id) {
            operator_delete((void *)local_e8._0_8_,
                            CONCAT44(local_e8.dest_handle.hid,local_e8.dest_id.gid) + 1);
          }
        }
        pFVar9->hasDestFilters = true;
        if ((command->flags & 0x200) == 0) {
          if (pBVar15 != (BasicHandleInfo *)0x0) {
            pbVar2 = (byte *)((long)&pBVar15->flags + 1);
            *pbVar2 = *pbVar2 | 0x40;
          }
          pFVar9->destFilter = _Var12._M_head_impl;
        }
        else {
          iVar7._M_current =
               (pFVar9->cloningDestFilters).
               super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar7._M_current ==
              (pFVar9->cloningDestFilters).
              super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<helics::FilterInfo*,std::allocator<helics::FilterInfo*>>::
            _M_realloc_insert<helics::FilterInfo*const&>
                      ((vector<helics::FilterInfo*,std::allocator<helics::FilterInfo*>> *)
                       &pFVar9->cloningDestFilters,iVar7,&local_168._M_head_impl);
          }
          else {
            *iVar7._M_current = _Var12._M_head_impl;
            pppFVar1 = &(pFVar9->cloningDestFilters).
                        super__Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppFVar1 = *pppFVar1 + 1;
          }
        }
      }
      else {
        ActionMessage::ActionMessage(&local_e8,cmd_error);
        local_e8.dest_id.gid = (command->source_id).gid;
        local_e8.source_id.gid = (command->dest_id).gid;
        local_e8.source_handle.hid = (command->dest_handle).hid;
        local_e8.messageID = -1;
        std::operator+(&local_108,"Endpoint ",&pBVar15->key);
        pbVar14 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                            (&local_108," already has a destination filter");
        pFVar17 = (FilterInfo *)(pbVar14->_M_dataplus)._M_p;
        paVar16 = &pbVar14->field_2;
        if (pFVar17 == (FilterInfo *)paVar16) {
          local_158._0_8_ = paVar16->_M_allocated_capacity;
          local_158._8_8_ = *(undefined8 *)((long)&pbVar14->field_2 + 8);
          pFVar17 = (FilterInfo *)local_158;
        }
        else {
          local_158._0_8_ = paVar16->_M_allocated_capacity;
        }
        size = pbVar14->_M_string_length;
        (pbVar14->_M_dataplus)._M_p = (pointer)paVar16;
        pbVar14->_M_string_length = 0;
        (pbVar14->field_2)._M_local_buf[0] = '\0';
        local_168._M_head_impl = pFVar17;
        local_160 = size;
        local_e8.payload.bufferSize = size;
        if ((pFVar17 != (FilterInfo *)local_e8.payload.heap) &&
           (SmallBuffer::reserve(&local_e8.payload,size), size != 0)) {
          memcpy(local_e8.payload.heap,pFVar17,size);
        }
        if (local_168._M_head_impl != (FilterInfo *)local_158) {
          operator_delete(local_168._M_head_impl,local_158._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if ((this->mSendMessageMove).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*(this->mSendMessageMove)._M_invoker)((_Any_data *)&this->mSendMessageMove,&local_e8);
        ActionMessage::~ActionMessage(&local_e8);
      }
    }
  }
  return;
}

Assistant:

void FilterFederate::processFilterInfo(ActionMessage& command)
{
    auto* filterC = getFilterCoordinator(command.dest_handle);
    if (filterC == nullptr) {
        return;
    }
    bool FilterAlreadyPresent = false;
    if (checkActionFlag(command, destination_target)) {
        if (checkActionFlag(command, clone_flag)) {
            for (auto& filt : filterC->cloningDestFilters) {
                if ((filt->core_id == command.source_id) &&
                    (filt->handle == command.source_handle)) {
                    FilterAlreadyPresent = true;
                    break;
                }
            }
        } else {  // there can only be one non-cloning destination filter
            if (filterC->destFilter != nullptr) {
                if ((filterC->destFilter->core_id == command.source_id) &&
                    (filterC->destFilter->handle == command.source_handle)) {
                    FilterAlreadyPresent = true;
                }
            }
        }

        if (!FilterAlreadyPresent) {
            auto* endhandle =
                mHandles->getInterfaceHandle(command.dest_handle, InterfaceType::ENDPOINT);
            if (endhandle != nullptr) {
                setActionFlag(*endhandle, has_dest_filter_flag);
                if ((!checkActionFlag(command, clone_flag)) && (filterC->hasDestFilters)) {
                    // duplicate non cloning destination filters are not allowed
                    ActionMessage err(CMD_ERROR);
                    err.dest_id = command.source_id;
                    err.setSource(command.getDest());
                    err.messageID = defs::Errors::REGISTRATION_FAILURE;
                    err.payload =
                        "Endpoint " + endhandle->key + " already has a destination filter";
                    mSendMessageMove(std::move(err));
                    return;
                }
            }
            auto* newFilter = getFilterInfo(command.getSource());
            if (newFilter == nullptr) {
                newFilter = createFilter(GlobalBrokerId(command.source_id),
                                         command.source_handle,
                                         std::string(command.payload.to_string()),
                                         command.getString(typeStringLoc),
                                         command.getString(typeOutStringLoc),
                                         checkActionFlag(command, clone_flag));
            }

            filterC->hasDestFilters = true;
            if (checkActionFlag(command, clone_flag)) {
                filterC->cloningDestFilters.push_back(newFilter);
            } else {
                if (endhandle != nullptr) {
                    setActionFlag(*endhandle, has_non_cloning_dest_filter_flag);
                }
                filterC->destFilter = newFilter;
            }
        }
    } else {
        for (auto& filt : filterC->allSourceFilters) {
            if ((filt->core_id == command.source_id) && (filt->handle == command.source_handle)) {
                FilterAlreadyPresent = true;
                break;
            }
        }
        if (!FilterAlreadyPresent) {
            auto* newFilter = getFilterInfo(command.getSource());
            if (newFilter == nullptr) {
                newFilter = createFilter(GlobalBrokerId(command.source_id),
                                         command.source_handle,
                                         std::string(command.payload.to_string()),
                                         command.getString(typeStringLoc),
                                         command.getString(typeOutStringLoc),
                                         checkActionFlag(command, clone_flag));
            }
            filterC->allSourceFilters.push_back(newFilter);
            filterC->hasSourceFilters = true;
            auto* endhandle =
                mHandles->getInterfaceHandle(command.dest_handle, InterfaceType::ENDPOINT);
            if (endhandle != nullptr) {
                setActionFlag(*endhandle, has_source_filter_flag);
            }
        }
    }
}